

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiWindow_*> *windows;
  ImVector<ImGuiPlatformMonitor> *this;
  ImVector<ImGuiPopupData> *this_00;
  ImVector<ImGuiDockNodeSettings> *this_01;
  float fVar1;
  float fVar2;
  ImGuiViewportP *viewport;
  ImGuiDockNode *pIVar3;
  undefined1 auVar4 [16];
  ImGuiContext *ctx;
  ImGuiContext *pIVar5;
  bool bVar6;
  uint uVar7;
  ImGuiContext *g;
  ImGuiIO *pIVar8;
  ImGuiPlatformMonitor *pIVar9;
  ImGuiViewportP **ppIVar10;
  ImGuiWindow *extraout_RAX;
  undefined7 extraout_var;
  char *pcVar11;
  ImDrawList **ppIVar12;
  ImGuiPopupData *pIVar13;
  ImGuiTabBar *tab_bar;
  ImGuiStoragePair *pIVar14;
  ImGuiSettingsHandler *pIVar15;
  ImGuiWindowSettings *pIVar16;
  ImGuiDockNodeSettings *pIVar17;
  ImGuiWindow *pIVar18;
  ImGuiWindowSettings *pIVar19;
  ImGuiWindow **ppIVar20;
  ImDrawList *pIVar21;
  ImGuiViewport *viewport_00;
  void *ptr_id;
  char *pcVar22;
  char *pcVar23;
  ulong uVar24;
  int rect_n;
  int iVar25;
  ImGuiID IVar26;
  long lVar27;
  int i;
  ImGuiID IVar28;
  char *pcVar29;
  char *pcVar30;
  int draw_list_i;
  int i_00;
  ImVector<ImDrawList_*> *this_02;
  int layer_i;
  float fVar31;
  float fVar34;
  ImVec2 IVar32;
  undefined1 auVar33 [16];
  float fVar35;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  ImVec2 pos;
  ImVec2 local_c0;
  ImRect r;
  undefined1 local_78 [8];
  ImVec2 local_70;
  char *wrt_rects_names [7];
  
  bVar6 = Begin("Dear ImGui Metrics",p_open,0);
  ctx = GImGui;
  if (bVar6) {
    wrt_rects_names[6] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    pIVar8 = GetIO();
    Text("Dear ImGui %s","1.80 WIP");
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / pIVar8->Framerate),
         SUB84((double)pIVar8->Framerate,0));
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)pIVar8->MetricsRenderVertices,
         (ulong)(uint)pIVar8->MetricsRenderIndices);
    Text("%d active windows (%d visible)",(ulong)(uint)pIVar8->MetricsActiveWindows,
         (ulong)(uint)pIVar8->MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)pIVar8->MetricsActiveAllocations);
    Separator();
    bVar6 = TreeNode("Tools");
    if (bVar6) {
      auVar4._8_8_ = 0;
      auVar4._0_4_ = r.Max.x;
      auVar4._4_4_ = r.Max.y;
      r = (ImRect)(auVar4 << 0x40);
      bVar6 = Button("Item Picker..",&r.Min);
      if (bVar6) {
        GImGui->DebugItemPickerActive = true;
      }
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
      Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
      SameLine(0.0,-1.0);
      pIVar5 = GImGui;
      fVar31 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar5->NextItemData).Width = fVar31 * 12.0;
      bVar6 = Combo("##show_windows_rect_type",&ShowMetricsWindow::show_windows_rect_type,
                    wrt_rects_names,7,7);
      ShowMetricsWindow::show_windows_rects = (bool)(ShowMetricsWindow::show_windows_rects | bVar6);
      if ((ShowMetricsWindow::show_windows_rects != false) && (ctx->NavWindow != (ImGuiWindow *)0x0)
         ) {
        BulletText("\'%s\':",ctx->NavWindow->Name);
        Indent(0.0);
        for (lVar27 = 0; lVar27 != 7; lVar27 = lVar27 + 1) {
          ShowMetricsWindow::Funcs::GetWindowRect(ctx->NavWindow,(int)lVar27);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",wrt_rects_names[lVar27]);
        }
        Unindent(0.0);
      }
      Checkbox("Show mesh when hovering ImDrawCmd",&ShowMetricsWindow::show_drawcmd_mesh);
      Checkbox("Show bounding boxes when hovering ImDrawCmd",&ShowMetricsWindow::show_drawcmd_aabb);
      TreePop();
    }
    windows = &ctx->Windows;
    ShowMetricsWindow::Funcs::NodeWindows(windows,"Windows");
    bVar6 = TreeNode("Viewport","Viewports (%d)",(ulong)(uint)(ctx->Viewports).Size);
    if (bVar6) {
      fVar31 = GetTreeNodeToLabelSpacing();
      Indent(fVar31);
      ShowViewportThumbnails();
      fVar31 = GetTreeNodeToLabelSpacing();
      Unindent(fVar31);
      bVar6 = TreeNode("Monitors","Monitors (%d)",(ulong)(uint)(ctx->PlatformIO).Monitors.Size);
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Dear ImGui uses monitor data:\n- to query DPI settings on a per monitor basis\n- to position popup/tooltips so they don\'t straddle monitors."
                       );
      if (bVar6) {
        this = &(ctx->PlatformIO).Monitors;
        uVar24 = 0;
        while (iVar25 = (int)uVar24, iVar25 < this->Size) {
          pIVar9 = ImVector<ImGuiPlatformMonitor>::operator[](this,iVar25);
          fVar31 = (pIVar9->MainPos).x;
          fVar34 = (pIVar9->MainPos).y;
          fVar35 = (pIVar9->MainSize).x;
          fVar1 = (pIVar9->MainSize).y;
          fVar2 = (pIVar9->WorkPos).x;
          in_stack_fffffffffffffee8 = (char *)(double)(pIVar9->WorkPos).y;
          in_stack_fffffffffffffef0 = (char *)(double)(fVar2 + (pIVar9->WorkSize).x);
          BulletText("Monitor #%d: DPI %.0f%%\n MainMin (%.0f,%.0f), MainMax (%.0f,%.0f), MainSize (%.0f,%.0f)\n WorkMin (%.0f,%.0f), WorkMax (%.0f,%.0f), WorkSize (%.0f,%.0f)"
                     ,(double)(pIVar9->DpiScale * 100.0),SUB84((double)fVar31,0),
                     SUB84((double)fVar34,0),(double)(fVar31 + fVar35),(double)(fVar34 + fVar1),
                     (double)fVar35,(double)fVar1,(double)fVar2,uVar24);
          uVar24 = (ulong)(iVar25 + 1);
        }
        TreePop();
      }
      for (iVar25 = 0; iVar25 < (ctx->Viewports).Size; iVar25 = iVar25 + 1) {
        ppIVar10 = ImVector<ImGuiViewportP_*>::operator[](&ctx->Viewports,iVar25);
        viewport = *ppIVar10;
        SetNextItemOpen(true,2);
        ptr_id = (void *)(ulong)(viewport->super_ImGuiViewport).ID;
        bVar6 = TreeNode(ptr_id,"Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"",
                         (ulong)*(uint *)&(viewport->super_ImGuiViewport).field_0x64,ptr_id,
                         (ulong)(viewport->super_ImGuiViewport).ParentViewportId);
        if (bVar6) {
          uVar7 = (viewport->super_ImGuiViewport).Flags;
          BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%"
                     ,(double)(viewport->super_ImGuiViewport).Pos.x,
                     SUB84((double)(viewport->super_ImGuiViewport).Pos.y,0),
                     SUB84((double)(viewport->super_ImGuiViewport).Size.x,0),
                     (double)(viewport->super_ImGuiViewport).Size.y,
                     (double)(viewport->super_ImGuiViewport).WorkOffsetMin.x,
                     (double)(viewport->super_ImGuiViewport).WorkOffsetMin.y,
                     (double)(viewport->super_ImGuiViewport).WorkOffsetMax.x,
                     (double)(viewport->super_ImGuiViewport).WorkOffsetMax.y,
                     (ulong)(uint)(int)viewport->PlatformMonitor);
          pIVar18 = extraout_RAX;
          if (0 < *(int *)&(viewport->super_ImGuiViewport).field_0x64) {
            SameLine(0.0,-1.0);
            bVar6 = SmallButton("Reset Pos");
            pIVar18 = (ImGuiWindow *)CONCAT71(extraout_var,bVar6);
            if (bVar6) {
              (viewport->super_ImGuiViewport).Pos.x = 200.0;
              (viewport->super_ImGuiViewport).Pos.y = 200.0;
              pIVar18 = viewport->Window;
              if (pIVar18 != (ImGuiWindow *)0x0) {
                (pIVar18->Pos).x = 200.0;
                (pIVar18->Pos).y = 200.0;
              }
            }
          }
          pcVar23 = " CanHostOtherWindows";
          if ((uVar7 >> 9 & 1) == 0) {
            pcVar23 = "";
          }
          pcVar22 = " NoDecoration";
          if ((uVar7 & 1) == 0) {
            pcVar22 = "";
          }
          pcVar29 = " NoFocusOnAppearing";
          if ((uVar7 & 4) == 0) {
            pcVar29 = "";
          }
          auVar33._0_4_ = -(uint)((uVar7 & 0x100) == 0);
          auVar33._4_4_ = -(uint)((uVar7 & 0x80) == 0);
          auVar33._8_4_ = -(uint)((uVar7 & 0x20) == 0);
          auVar33._12_4_ = -(uint)((uVar7 & 0x10) == 0);
          uVar7 = movmskps((int)pIVar18,auVar33);
          pcVar30 = " NoInputs";
          if ((uVar7 & 8) != 0) {
            pcVar30 = "";
          }
          in_stack_fffffffffffffee8 = " NoRendererClear";
          if ((uVar7 & 4) != 0) {
            in_stack_fffffffffffffee8 = "";
          }
          in_stack_fffffffffffffef0 = " Minimized";
          if ((uVar7 & 2) != 0) {
            in_stack_fffffffffffffef0 = "";
          }
          pcVar11 = " NoAutoMerge";
          if ((uVar7 & 1) != 0) {
            pcVar11 = "";
          }
          BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s",
                     (ulong)(uint)(viewport->super_ImGuiViewport).Flags,pcVar23,pcVar22,pcVar29,
                     pcVar30,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,pcVar11);
          for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
            this_02 = (viewport->DrawDataBuilder).Layers + lVar27;
            for (i_00 = 0; i_00 < this_02->Size; i_00 = i_00 + 1) {
              ppIVar12 = ImVector<ImDrawList_*>::operator[](this_02,i_00);
              ShowMetricsWindow::Funcs::NodeDrawList((ImGuiWindow *)0x0,viewport,*ppIVar12,pcVar22);
            }
          }
          TreePop();
        }
      }
      TreePop();
    }
    bVar6 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(ctx->OpenPopupStack).Size);
    if (bVar6) {
      this_00 = &ctx->OpenPopupStack;
      for (iVar25 = 0; iVar25 < this_00->Size; iVar25 = iVar25 + 1) {
        pIVar13 = ImVector<ImGuiPopupData>::operator[](this_00,iVar25);
        pIVar18 = pIVar13->Window;
        pIVar13 = ImVector<ImGuiPopupData>::operator[](this_00,iVar25);
        pcVar22 = "";
        pcVar23 = "NULL";
        pcVar29 = "";
        if (pIVar18 != (ImGuiWindow *)0x0) {
          pcVar23 = pIVar18->Name;
          pcVar22 = " ChildWindow";
          if (((uint)pIVar18->Flags >> 0x18 & 1) == 0) {
            pcVar22 = "";
          }
          pcVar29 = " ChildMenu";
          if (((uint)pIVar18->Flags >> 0x1c & 1) == 0) {
            pcVar29 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar13->PopupId,pcVar23,pcVar22,
                   pcVar29);
      }
      TreePop();
    }
    iVar25 = 0;
    bVar6 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(ctx->TabBars).Buf.Size);
    if (bVar6) {
      for (; iVar25 < (ctx->TabBars).Buf.Size; iVar25 = iVar25 + 1) {
        tab_bar = ImVector<ImGuiTabBar>::operator[](&(ctx->TabBars).Buf,iVar25);
        ShowMetricsWindow::Funcs::NodeTabBar(tab_bar);
      }
      TreePop();
    }
    bVar6 = TreeNode("Dock nodes");
    if (bVar6) {
      Checkbox("List root nodes",&ShowMetricsWindow::root_nodes_only);
      Checkbox("Ctrl shows window dock info",&ShowMetricsWindow::show_docking_nodes);
      bVar6 = SmallButton("Clear nodes");
      if (bVar6) {
        DockContextClearNodes(ctx,0,true);
      }
      SameLine(0.0,-1.0);
      bVar6 = SmallButton("Rebuild all");
      if (bVar6) {
        (ctx->DockContext).WantFullRebuild = true;
      }
      for (iVar25 = 0; iVar25 < (ctx->DockContext).Nodes.Data.Size; iVar25 = iVar25 + 1) {
        pIVar14 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                            ((ImVector<ImGuiStorage::ImGuiStoragePair> *)&ctx->DockContext,iVar25);
        pIVar3 = (ImGuiDockNode *)(pIVar14->field_1).val_p;
        if ((pIVar3 != (ImGuiDockNode *)0x0) &&
           ((ShowMetricsWindow::root_nodes_only != true ||
            (pIVar3->ParentNode == (ImGuiDockNode *)0x0)))) {
          ShowMetricsWindow::Funcs::NodeDockNode(pIVar3,"Node");
        }
      }
      TreePop();
    }
    bVar6 = TreeNode("Settings");
    if (bVar6) {
      bVar6 = SmallButton("Clear");
      if (bVar6) {
        ClearIniSettings();
      }
      SameLine(0.0,-1.0);
      bVar6 = SmallButton("Save to memory");
      if (bVar6) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      SameLine(0.0,-1.0);
      bVar6 = SmallButton("Save to disk");
      if (bVar6) {
        SaveIniSettingsToDisk((ctx->IO).IniFilename);
      }
      SameLine(0.0,-1.0);
      if ((ctx->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",(double)ctx->SettingsDirtyTimer);
      bVar6 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(ctx->SettingsHandlers).Size);
      if (bVar6) {
        for (iVar25 = 0; iVar25 < (ctx->SettingsHandlers).Size; iVar25 = iVar25 + 1) {
          pIVar15 = ImVector<ImGuiSettingsHandler>::operator[](&ctx->SettingsHandlers,iVar25);
          BulletText("%s",pIVar15->TypeName);
        }
        TreePop();
      }
      bVar6 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                       (ulong)(uint)(ctx->SettingsWindows).Buf.Size);
      if (bVar6) {
        pcVar23 = (ctx->SettingsWindows).Buf.Data;
        pIVar16 = (ImGuiWindowSettings *)(pcVar23 + 4);
        if (pcVar23 == (char *)0x0) {
          pIVar16 = (ImGuiWindowSettings *)0x0;
        }
        for (; pIVar16 != (ImGuiWindowSettings *)0x0;
            pIVar16 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,pIVar16))
        {
          in_stack_fffffffffffffef0 =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                                (uint)pIVar16->Collapsed);
          in_stack_fffffffffffffee8 =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                                (int)(pIVar16->Size).y);
          Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)pIVar16->ID,pIVar16 + 1,
               (ulong)(uint)(int)(pIVar16->Pos).x,(ulong)(uint)(int)(pIVar16->Pos).y,
               (ulong)(uint)(int)(pIVar16->Size).x,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffef0);
        }
        TreePop();
      }
      bVar6 = TreeNode("SettingsDocking","Settings packed data: Docking");
      if (bVar6) {
        Text("In SettingsWindows:");
        pcVar23 = (ctx->SettingsWindows).Buf.Data;
        pIVar16 = (ImGuiWindowSettings *)(pcVar23 + 4);
        if (pcVar23 == (char *)0x0) {
          pIVar16 = (ImGuiWindowSettings *)0x0;
        }
        for (; pIVar16 != (ImGuiWindowSettings *)0x0;
            pIVar16 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,pIVar16))
        {
          if (pIVar16->DockId != 0) {
            BulletText("Window \'%s\' -> DockId %08X",pIVar16 + 1);
          }
        }
        Text("In SettingsNodes:");
        this_01 = &(ctx->DockContext).NodesSettings;
        for (iVar25 = 0; iVar25 < this_01->Size; iVar25 = iVar25 + 1) {
          pIVar17 = ImVector<ImGuiDockNodeSettings>::operator[](this_01,iVar25);
          uVar7 = pIVar17->SelectedWindowId;
          uVar24 = (ulong)uVar7;
          if (uVar7 == 0) {
            uVar24 = 0;
            pIVar16 = (ImGuiWindowSettings *)0x0;
          }
          else {
            pIVar18 = FindWindowByID(uVar7);
            if (pIVar18 == (ImGuiWindow *)0x0) {
              pIVar19 = FindWindowSettings(uVar7);
              pIVar16 = pIVar19 + 1;
              if (pIVar19 == (ImGuiWindowSettings *)0x0) {
                pIVar16 = (ImGuiWindowSettings *)0x0;
              }
              uVar24 = (ulong)pIVar17->SelectedWindowId;
            }
            else {
              pIVar16 = (ImGuiWindowSettings *)pIVar18->Name;
            }
          }
          pcVar23 = "";
          if ((int)uVar24 != 0) {
            pcVar23 = "N/A";
          }
          if (pIVar16 != (ImGuiWindowSettings *)0x0) {
            pcVar23 = (char *)pIVar16;
          }
          BulletText("Node %08X, Parent %08X, SelectedTab %08X (\'%s\')",(ulong)pIVar17->ID,
                     (ulong)pIVar17->ParentNodeId,uVar24,pcVar23);
        }
        TreePop();
      }
      iVar25 = (ctx->SettingsIniData).Buf.Size;
      uVar24 = (ulong)(iVar25 - 1);
      if (iVar25 == 0) {
        uVar24 = 0;
      }
      bVar6 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar24);
      if (bVar6) {
        pcVar23 = (ctx->SettingsIniData).Buf.Data;
        pcVar22 = ImGuiTextBuffer::EmptyString;
        if (pcVar23 != (char *)0x0) {
          pcVar22 = pcVar23;
        }
        r.Min.x = -1.1754944e-38;
        r.Min.y = 0.0;
        InputTextMultiline("##Ini",pcVar22,(long)(ctx->SettingsIniData).Buf.Size,&r.Min,0x4000,
                           (ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar6 = TreeNode("Internal state");
    if (bVar6) {
      pcVar22 = "NULL";
      Text("WINDOWING");
      Indent(0.0);
      pcVar23 = "NULL";
      if (ctx->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar23 = ctx->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar23);
      pcVar23 = "NULL";
      if (ctx->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar23 = ctx->HoveredRootWindow->Name;
      }
      IVar28 = 0;
      Text("HoveredRootWindow: \'%s\'",pcVar23);
      if (ctx->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar22 = ctx->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar22);
      if (ctx->HoveredDockNode != (ImGuiDockNode *)0x0) {
        IVar28 = ctx->HoveredDockNode->ID;
      }
      IVar26 = 0;
      Text("HoveredDockNode: 0x%08X",(ulong)IVar28);
      if (ctx->MovingWindow == (ImGuiWindow *)0x0) {
        pcVar23 = "NULL";
      }
      else {
        pcVar23 = ctx->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar23);
      if (ctx->MouseLastHoveredViewport != (ImGuiViewportP *)0x0) {
        IVar26 = (ctx->MouseLastHoveredViewport->super_ImGuiViewport).ID;
      }
      Text("MouseViewport: 0x%08X (UserHovered 0x%08X, LastHovered 0x%08X)",
           (ulong)(ctx->MouseViewport->super_ImGuiViewport).ID,(ulong)(ctx->IO).MouseHoveredViewport
           ,(ulong)IVar26);
      Unindent(0.0);
      Text("ITEMS");
      Indent(0.0);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (double)ctx->ActiveIdTimer,(ulong)ctx->ActiveId,(ulong)ctx->ActiveIdPreviousFrame,
           (ulong)ctx->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_001bbb50 + (ulong)ctx->ActiveIdSource * 8));
      pcVar22 = "NULL";
      pcVar23 = "NULL";
      if (ctx->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar23 = ctx->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar23);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(double)ctx->HoveredIdTimer,
           (ulong)ctx->HoveredId,(ulong)ctx->HoveredIdPreviousFrame,
           (ulong)ctx->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)ctx->DragDropActive,
           (ulong)(ctx->DragDropPayload).SourceId,(ctx->DragDropPayload).DataType,
           (ulong)(uint)(ctx->DragDropPayload).DataSize);
      Unindent(0.0);
      Text("NAV,FOCUS");
      Indent(0.0);
      pcVar23 = "NULL";
      if (ctx->NavWindow != (ImGuiWindow *)0x0) {
        pcVar23 = ctx->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar23);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)ctx->NavId,(ulong)ctx->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001bbb50 + (ulong)ctx->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)(ctx->IO).NavActive,(ulong)(ctx->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)ctx->NavActivateId,
           (ulong)ctx->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)ctx->NavDisableHighlight,
           (ulong)ctx->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)ctx->NavFocusScopeId);
      if (ctx->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar22 = ctx->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar22);
      Unindent(0.0);
      TreePop();
    }
    if ((ShowMetricsWindow::show_windows_rects != false) ||
       (ShowMetricsWindow::show_windows_begin_order == true)) {
      for (iVar25 = 0; iVar25 < windows->Size; iVar25 = iVar25 + 1) {
        ppIVar20 = ImVector<ImGuiWindow_*>::operator[](windows,iVar25);
        pIVar18 = *ppIVar20;
        if (pIVar18->WasActive == true) {
          pIVar21 = GetForegroundDrawList(pIVar18);
          if (ShowMetricsWindow::show_windows_rects == true) {
            r = ShowMetricsWindow::Funcs::GetWindowRect
                          (pIVar18,ShowMetricsWindow::show_windows_rect_type);
            ImDrawList::AddRect(pIVar21,&r.Min,&r.Max,0xff8000ff,0.0,0xf,1.0);
          }
          if ((ShowMetricsWindow::show_windows_begin_order == true) &&
             ((pIVar18->Flags & 0x1000000) == 0)) {
            ImFormatString((char *)&r,0x20,"%d",(ulong)(uint)(int)pIVar18->BeginOrderWithinContext);
            pos.x = GImGui->FontSize + (pIVar18->Pos).x;
            pos.y = GImGui->FontSize + (pIVar18->Pos).y;
            ImDrawList::AddRectFilled(pIVar21,&pIVar18->Pos,&pos,0xff6464c8,0.0,0xf);
            ImDrawList::AddText(pIVar21,&pIVar18->Pos,0xffffffff,(char *)&r,(char *)0x0);
          }
        }
      }
    }
    if (((ShowMetricsWindow::show_docking_nodes == true) && ((ctx->IO).KeyCtrl == true)) &&
       (pIVar3 = ctx->HoveredDockNode, pIVar3 != (ImGuiDockNode *)0x0)) {
      r = (ImRect)ZEXT816(0);
      if (pIVar3->HostWindow == (ImGuiWindow *)0x0) {
        viewport_00 = GetMainViewport();
        pIVar21 = GetForegroundDrawList(viewport_00);
      }
      else {
        pIVar21 = GetForegroundDrawList(pIVar3->HostWindow);
      }
      pcVar23 = " *CentralNode*";
      if (((uint)pIVar3->LocalFlags >> 0xb & 1) == 0) {
        pcVar23 = "";
      }
      iVar25 = ImFormatString((char *)&r,0x40,"DockId: %X%s\n",(ulong)pIVar3->ID,pcVar23);
      pcVar23 = (char *)((long)&r.Min.x + (long)iVar25);
      iVar25 = ImFormatString(pcVar23,0x40 - (long)iVar25,"WindowClass: %08X\n",
                              (ulong)(pIVar3->WindowClass).ClassId);
      pcVar23 = pcVar23 + iVar25;
      iVar25 = ImFormatString(pcVar23,(size_t)(local_78 + -(long)pcVar23),"Size: (%.0f, %.0f)\n",
                              (double)(pIVar3->Size).x,SUB84((double)(pIVar3->Size).y,0));
      ImFormatString(pcVar23 + iVar25,(size_t)(local_78 + -(long)(pcVar23 + iVar25)),
                     "SizeRef: (%.0f, %.0f)\n",(double)(pIVar3->SizeRef).x,
                     SUB84((double)(pIVar3->SizeRef).y,0));
      iVar25 = DockNodeGetDepth(pIVar3);
      fVar35 = (float)iVar25 * 3.0;
      fVar31 = (pIVar3->Pos).x;
      fVar34 = (pIVar3->Pos).y;
      pos.y = fVar34 + fVar35;
      pos.x = fVar31 + fVar35;
      local_c0.y = ((pIVar3->Size).y + fVar34) - fVar35;
      local_c0.x = ((pIVar3->Size).x + fVar31) - fVar35;
      ImDrawList::AddRect(pIVar21,&pos,&local_c0,0xff6464c8,0.0,0xf,1.0);
      fVar31 = (pIVar3->Pos).x + fVar35;
      fVar35 = (pIVar3->Pos).y + fVar35;
      pos.y = fVar35;
      pos.x = fVar31;
      local_c0.x = fVar31 + -1.0;
      local_c0.y = fVar35 + -1.0;
      IVar32 = CalcTextSize((char *)&r,(char *)0x0,false,-1.0);
      local_70.x = IVar32.x + fVar31 + 1.0;
      local_70.y = IVar32.y + fVar35 + 1.0;
      ImDrawList::AddRectFilled(pIVar21,&local_c0,&local_70,0xff6464c8,0.0,0xf);
      ImDrawList::AddText(pIVar21,(ImFont *)0x0,0.0,&pos,0xffffffff,(char *)&r,(char *)0x0,0.0,
                          (ImVec4 *)0x0);
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("Dear ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentRowsFrozen, TRT_ColumnsContentRowsUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentRowsFrozen", "ColumnsContentRowsUnfrozen" };

    // State
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = WRT_WorkRect;
    static bool show_windows_begin_order = false;
    static bool show_tables_rects = false;
    static int  show_tables_rect_type = TRT_WorkRect;
    static bool show_drawcmd_mesh = true;
    static bool show_drawcmd_aabb = true;
    static bool show_docking_nodes = false;

    // Basic info
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    // Helper functions to display common structures:
    // - NodeDrawList()
    // - NodeColumns()
    // - NodeWindow()
    // - NodeWindows()
    // - NodeViewport()
    // - NodeDockNode()
    // - NodeTabBar()
    // - NodeStorage()
    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }

        static void NodeDrawCmdShowMeshAndBoundingBox(ImDrawList* fg_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }

        // Note that both 'window' and 'viewport' may be NULL here. Viewport is generally null of destroyed popups which previously owned a viewport.
        static void NodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
            if (window && fg_draw_list && ImGui::IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper;
                clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
                    {
                        char* buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            ImGui::Text("(In front-to-back order:)");
            for (int i = windows.Size - 1; i >= 0; i--) // Iterate front to back
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }

            ImGuiContext& g = *GImGui;
            const bool is_active = window->WasActive;
            ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            const bool open = ImGui::TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
            if (!is_active) { PopStyleColor(); }
            if (ImGui::IsItemHovered() && is_active)
                ImGui::GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->Viewport, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("WindowClassId: 0x%08X", window->WindowClass.ClassId);
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            ImGui::BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)", window->Viewport ? window->Viewport->Idx : -1, window->ViewportOwned ? " (Owned)" : "", window->ViewportId, window->ViewportPos.x, window->ViewportPos.y);
            ImGui::BulletText("ViewportMonitor: %d", window->Viewport ? window->Viewport->PlatformMonitor : -1);
            ImGui::BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d", window->DockId, window->DockOrder, window->DockIsActive, window->DockTabIsVisible);
            if (window->DockNode || window->DockNodeAsHost)
                NodeDockNode(window->DockNodeAsHost ? window->DockNodeAsHost : window->DockNode, window->DockNodeAsHost ? "DockNodeAsHost" : "DockNode");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->RootWindowDockStop != window->RootWindow) NodeWindow(window->RootWindowDockStop, "RootWindowDockStop");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }

        static void NodeWindowSettings(ImGuiWindowSettings* settings)
        {
            ImGui::Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",
                settings->ID, settings->GetName(), settings->Pos.x, settings->Pos.y, settings->Size.x, settings->Size.y, settings->Collapsed);
        }

        static void NodeViewport(ImGuiViewportP* viewport)
        {
            ImGui::SetNextItemOpen(true, ImGuiCond_Once);
            if (ImGui::TreeNode((void*)(intptr_t)viewport->ID, "Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"", viewport->Idx, viewport->ID, viewport->ParentViewportId, viewport->Window ? viewport->Window->Name : "N/A"))
            {
                ImGuiWindowFlags flags = viewport->Flags;
                ImGui::BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%",
                    viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
                    viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y,
                    viewport->PlatformMonitor, viewport->DpiScale * 100.0f);
                if (viewport->Idx > 0) { ImGui::SameLine(); if (ImGui::SmallButton("Reset Pos")) { viewport->Pos = ImVec2(200,200); if (viewport->Window) viewport->Window->Pos = ImVec2(200,200); } }
                ImGui::BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s", viewport->Flags,
                    (flags & ImGuiViewportFlags_CanHostOtherWindows) ? " CanHostOtherWindows" : "", (flags & ImGuiViewportFlags_NoDecoration) ? " NoDecoration" : "",
                    (flags & ImGuiViewportFlags_NoFocusOnAppearing)  ? " NoFocusOnAppearing"  : "", (flags & ImGuiViewportFlags_NoInputs)     ? " NoInputs"     : "",
                    (flags & ImGuiViewportFlags_NoRendererClear)     ? " NoRendererClear"     : "", (flags & ImGuiViewportFlags_Minimized)    ? " Minimized"    : "",
                    (flags & ImGuiViewportFlags_NoAutoMerge)         ? " NoAutoMerge"         : "");
                for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                    for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                        Funcs::NodeDrawList(NULL, viewport, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
                ImGui::TreePop();
            }
        }

        static void NodeDockNode(ImGuiDockNode* node, const char* label)
        {
            ImGuiContext& g = *GImGui;
            const bool is_alive = (g.FrameCount - node->LastFrameAlive < 2);    // Submitted with ImGuiDockNodeFlags_KeepAliveOnly
            const bool is_active = (g.FrameCount - node->LastFrameActive < 2);  // Submitted
            if (!is_alive) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            bool open;
            if (node->Windows.Size > 0)
                open = ImGui::TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %d windows (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", node->Windows.Size, node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
            else
                open = ImGui::TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %s split (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", (node->SplitAxis == ImGuiAxis_X) ? "horizontal" : (node->SplitAxis == ImGuiAxis_Y) ? "vertical" : "n/a", node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
            if (!is_alive) { PopStyleColor(); }
            if (is_active && ImGui::IsItemHovered())
                if (ImGuiWindow* window = node->HostWindow ? node->HostWindow : node->VisibleWindow)
                    GetForegroundDrawList(window)->AddRect(node->Pos, node->Pos + node->Size, IM_COL32(255, 255, 0, 255));
            if (open)
            {
                IM_ASSERT(node->ChildNodes[0] == NULL || node->ChildNodes[0]->ParentNode == node);
                IM_ASSERT(node->ChildNodes[1] == NULL || node->ChildNodes[1]->ParentNode == node);
                ImGui::BulletText("Pos (%.0f,%.0f), Size (%.0f, %.0f) Ref (%.0f, %.0f)",
                    node->Pos.x, node->Pos.y, node->Size.x, node->Size.y, node->SizeRef.x, node->SizeRef.y);
                NodeWindow(node->HostWindow, "HostWindow");
                NodeWindow(node->VisibleWindow, "VisibleWindow");
                ImGui::BulletText("SelectedTabID: 0x%08X, LastFocusedNodeID: 0x%08X", node->SelectedTabId, node->LastFocusedNodeId);
                ImGui::BulletText("Misc:%s%s%s%s%s",
                    node->IsDockSpace() ? " IsDockSpace" : "",
                    node->IsCentralNode() ? " IsCentralNode" : "",
                    is_alive ? " IsAlive" : "", is_active ? " IsActive" : "",
                    node->WantLockSizeOnce ? " WantLockSizeOnce" : "");
                if (ImGui::TreeNode("flags", "LocalFlags: 0x%04X SharedFlags: 0x%04X", node->LocalFlags, node->SharedFlags))
                {
                    ImGui::CheckboxFlags("LocalFlags: NoDocking", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoDocking);
                    ImGui::CheckboxFlags("LocalFlags: NoSplit", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoSplit);
                    ImGui::CheckboxFlags("LocalFlags: NoResize", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResize);
                    ImGui::CheckboxFlags("LocalFlags: NoResizeX", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResizeX);
                    ImGui::CheckboxFlags("LocalFlags: NoResizeY", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResizeY);
                    ImGui::CheckboxFlags("LocalFlags: NoTabBar", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoTabBar);
                    ImGui::CheckboxFlags("LocalFlags: HiddenTabBar", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_HiddenTabBar);
                    ImGui::CheckboxFlags("LocalFlags: NoWindowMenuButton", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoWindowMenuButton);
                    ImGui::CheckboxFlags("LocalFlags: NoCloseButton", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoCloseButton);
                    ImGui::TreePop();
                }
                if (node->ParentNode)
                    NodeDockNode(node->ParentNode, "ParentNode");
                if (node->ChildNodes[0])
                    NodeDockNode(node->ChildNodes[0], "Child[0]");
                if (node->ChildNodes[1])
                    NodeDockNode(node->ChildNodes[1], "Child[1]");
                if (node->TabBar)
                    NodeTabBar(node->TabBar);
                ImGui::TreePop();
            }
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            const bool is_active = (tab_bar->PrevFrameVisible >= ImGui::GetFrameCount() - 2);
            p += ImFormatString(p, buf_end - p, "Tab Bar 0x%08X (%d tabs)%s", tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
            p += ImFormatString(p, buf_end - p, "  { ");
            for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
            {
                ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                p += ImFormatString(p, buf_end - p, "%s'%s'",
                    tab_n > 0 ? ", " : "", (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
            }
            p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            bool open = ImGui::TreeNode(tab_bar, "%s", buf);
            if (!is_active) { PopStyleColor(); }
            if (is_active && ImGui::IsItemHovered())
            {
                ImDrawList* draw_list = ImGui::GetForegroundDrawList();
                draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
                draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
                draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
            }
            if (open)
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                        tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }

        static void NodeStorage(ImGuiStorage* storage, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
                return;
            for (int n = 0; n < storage->Data.Size; n++)
            {
                const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
                ImGui::BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
            }
            ImGui::TreePop();
        }
    };

    // Tools
    if (ImGui::TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (ImGui::Button("Item Picker.."))
            ImGui::DebugStartItemPicker();
        ImGui::SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##show_windows_rect_type", &show_windows_rect_type, wrt_rects_names, WRT_Count, WRT_Count);
        if (show_windows_rects && g.NavWindow)
        {
            ImGui::BulletText("'%s':", g.NavWindow->Name);
            ImGui::Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                ImGui::Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            ImGui::Unindent();
        }
        ImGui::Checkbox("Show mesh when hovering ImDrawCmd", &show_drawcmd_mesh);
        ImGui::Checkbox("Show bounding boxes when hovering ImDrawCmd", &show_drawcmd_aabb);
        ImGui::TreePop();
    }

    // Contents
    Funcs::NodeWindows(g.Windows, "Windows");
    //Funcs::NodeWindows(g.WindowsFocusOrder, "WindowsFocusOrder");
    if (ImGui::TreeNode("Viewport", "Viewports (%d)", g.Viewports.Size))
    {
        ImGui::Indent(ImGui::GetTreeNodeToLabelSpacing());
        ImGui::ShowViewportThumbnails();
        ImGui::Unindent(ImGui::GetTreeNodeToLabelSpacing());
        bool open = ImGui::TreeNode("Monitors", "Monitors (%d)", g.PlatformIO.Monitors.Size);
        ImGui::SameLine();
        MetricsHelpMarker("Dear ImGui uses monitor data:\n- to query DPI settings on a per monitor basis\n- to position popup/tooltips so they don't straddle monitors.");
        if (open)
        {
            for (int i = 0; i < g.PlatformIO.Monitors.Size; i++)
            {
                const ImGuiPlatformMonitor& mon = g.PlatformIO.Monitors[i];
                ImGui::BulletText("Monitor #%d: DPI %.0f%%\n MainMin (%.0f,%.0f), MainMax (%.0f,%.0f), MainSize (%.0f,%.0f)\n WorkMin (%.0f,%.0f), WorkMax (%.0f,%.0f), WorkSize (%.0f,%.0f)",
                    i, mon.DpiScale * 100.0f,
                    mon.MainPos.x, mon.MainPos.y, mon.MainPos.x + mon.MainSize.x, mon.MainPos.y + mon.MainSize.y, mon.MainSize.x, mon.MainSize.y,
                    mon.WorkPos.x, mon.WorkPos.y, mon.WorkPos.x + mon.WorkSize.x, mon.WorkPos.y + mon.WorkSize.y, mon.WorkSize.x, mon.WorkSize.y);
            }
            ImGui::TreePop();
        }
        for (int i = 0; i < g.Viewports.Size; i++)
            Funcs::NodeViewport(g.Viewports[i]);
        ImGui::TreePop();
    }

    // Details for Popups
    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    // Details for TabBars
    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

    // Details for Tables
    IM_UNUSED(trt_rects_names);
    IM_UNUSED(show_tables_rects);
    IM_UNUSED(show_tables_rect_type);
#ifdef IMGUI_HAS_TABLE
    if (ImGui::TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            Funcs::NodeTable(g.Tables.GetByIndex(n));
        ImGui::TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (ImGui::TreeNode("Dock nodes"))
    {
        static bool root_nodes_only = true;
        ImGuiDockContext* dc = &g.DockContext;
        ImGui::Checkbox("List root nodes", &root_nodes_only);
        ImGui::Checkbox("Ctrl shows window dock info", &show_docking_nodes);
        if (ImGui::SmallButton("Clear nodes")) { DockContextClearNodes(&g, 0, true); }
        ImGui::SameLine();
        if (ImGui::SmallButton("Rebuild all")) { dc->WantFullRebuild = true; }
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (!root_nodes_only || node->IsRootNode())
                    Funcs::NodeDockNode(node, "Node");
        ImGui::TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (ImGui::TreeNode("Settings"))
    {
        if (ImGui::SmallButton("Clear"))
            ImGui::ClearIniSettings();
        ImGui::SameLine();
        if (ImGui::SmallButton("Save to memory"))
            ImGui::SaveIniSettingsToMemory();
        ImGui::SameLine();
        if (ImGui::SmallButton("Save to disk"))
            ImGui::SaveIniSettingsToDisk(g.IO.IniFilename);
        ImGui::SameLine();
        if (g.IO.IniFilename)
            ImGui::Text("\"%s\"", g.IO.IniFilename);
        else
            ImGui::TextUnformatted("<NULL>");
        ImGui::Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (ImGui::TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                ImGui::BulletText("%s", g.SettingsHandlers[n].TypeName);
            ImGui::TreePop();
        }
        if (ImGui::TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                Funcs::NodeWindowSettings(settings);
            ImGui::TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (ImGui::TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                Funcs::NodeTableSettings(settings);
            ImGui::TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
        if (ImGui::TreeNode("SettingsDocking", "Settings packed data: Docking"))
        {
            ImGuiDockContext* dc = &g.DockContext;
            ImGui::Text("In SettingsWindows:");
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                if (settings->DockId != 0)
                    ImGui::BulletText("Window '%s' -> DockId %08X", settings->GetName(), settings->DockId);
            ImGui::Text("In SettingsNodes:");
            for (int n = 0; n < dc->NodesSettings.Size; n++)
            {
                ImGuiDockNodeSettings* settings = &dc->NodesSettings[n];
                const char* selected_tab_name = NULL;
                if (settings->SelectedWindowId)
                {
                    if (ImGuiWindow* window = FindWindowByID(settings->SelectedWindowId))
                        selected_tab_name = window->Name;
                    else if (ImGuiWindowSettings* window_settings = FindWindowSettings(settings->SelectedWindowId))
                        selected_tab_name = window_settings->GetName();
                }
                ImGui::BulletText("Node %08X, Parent %08X, SelectedTab %08X ('%s')", settings->ID, settings->ParentNodeId, settings->SelectedWindowId, selected_tab_name ? selected_tab_name : settings->SelectedWindowId ? "N/A" : "");
            }
            ImGui::TreePop();
        }
#endif // #ifdef IMGUI_HAS_DOCK

        if (ImGui::TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            ImGui::InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, 0.0f), ImGuiInputTextFlags_ReadOnly);
            ImGui::TreePop();
        }
        ImGui::TreePop();
    }

    // Misc Details
    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        ImGui::Text("WINDOWING");
        ImGui::Indent();
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        ImGui::Text("HoveredDockNode: 0x%08X", g.HoveredDockNode ? g.HoveredDockNode->ID : 0);
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("MouseViewport: 0x%08X (UserHovered 0x%08X, LastHovered 0x%08X)", g.MouseViewport->ID, g.IO.MouseHoveredViewport, g.MouseLastHoveredViewport ? g.MouseLastHoveredViewport->ID : 0);
        ImGui::Unindent();

        ImGui::Text("ITEMS");
        ImGui::Indent();
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::Unindent();

        ImGui::Text("NAV,FOCUS");
        ImGui::Indent();
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Unindent();

        ImGui::TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r = Funcs::GetWindowRect(window, show_windows_rect_type);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (show_tables_rects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl && g.HoveredDockNode)
    {
        char buf[64] = "";
        char* p = buf;
        ImGuiDockNode* node = g.HoveredDockNode;
        ImDrawList* overlay_draw_list = node->HostWindow ? GetForegroundDrawList(node->HostWindow) : GetForegroundDrawList((ImGuiViewportP*)GetMainViewport());
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "DockId: %X%s\n", node->ID, node->IsCentralNode() ? " *CentralNode*" : "");
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "WindowClass: %08X\n", node->WindowClass.ClassId);
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "Size: (%.0f, %.0f)\n", node->Size.x, node->Size.y);
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "SizeRef: (%.0f, %.0f)\n", node->SizeRef.x, node->SizeRef.y);
        int depth = DockNodeGetDepth(node);
        overlay_draw_list->AddRect(node->Pos + ImVec2(3, 3) * (float)depth, node->Pos + node->Size - ImVec2(3, 3) * (float)depth, IM_COL32(200, 100, 100, 255));
        ImVec2 pos = node->Pos + ImVec2(3, 3) * (float)depth;
        overlay_draw_list->AddRectFilled(pos - ImVec2(1, 1), pos + CalcTextSize(buf) + ImVec2(1, 1), IM_COL32(200, 100, 100, 255));
        overlay_draw_list->AddText(NULL, 0.0f, pos, IM_COL32(255, 255, 255, 255), buf);
    }
#endif // #ifdef IMGUI_HAS_DOCK

    ImGui::End();
}